

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  stbi_uc *psVar4;
  byte *pbVar5;
  byte bVar6;
  
  psVar4 = s->img_buffer;
  if (psVar4 < s->img_buffer_end) {
LAB_00119760:
    s->img_buffer = psVar4 + 1;
  }
  else if (s->read_from_callbacks != 0) {
    psVar4 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar1;
    }
    psVar4 = s->img_buffer;
    goto LAB_00119760;
  }
  pbVar5 = s->img_buffer;
  if (pbVar5 < s->img_buffer_end) {
LAB_001197d3:
    s->img_buffer = pbVar5 + 1;
    if (1 < *pbVar5) {
      s->img_buffer = s->img_buffer_original;
      return 0;
    }
  }
  else if (s->read_from_callbacks != 0) {
    psVar4 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar1;
    }
    pbVar5 = s->img_buffer;
    goto LAB_001197d3;
  }
  pbVar5 = s->img_buffer;
  if (s->img_buffer_end <= pbVar5) {
    if (s->read_from_callbacks == 0) {
      return 0;
    }
    psVar4 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar1;
    }
    pbVar5 = s->img_buffer;
  }
  s->img_buffer = pbVar5 + 1;
  if ((byte)((*pbVar5 & 0xf7) - 4) < 0xfd) {
    return 0;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001198b4:
    s->img_buffer = s->img_buffer + 9;
  }
  else {
    iVar1 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (8 < iVar1) goto LAB_001198b4;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,9 - iVar1);
  }
  iVar1 = stbi__get16le(s);
  if ((iVar1 == 0) || (iVar2 = stbi__get16le(s), iVar2 == 0)) goto LAB_0011999d;
  pbVar5 = s->img_buffer;
  if (pbVar5 < s->img_buffer_end) {
LAB_00119960:
    s->img_buffer = pbVar5 + 1;
    bVar6 = *pbVar5;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar4 = s->buffer_start;
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar4;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar4;
        s->img_buffer_end = psVar4 + iVar3;
      }
      pbVar5 = s->img_buffer;
      goto LAB_00119960;
    }
    bVar6 = 0;
  }
  if ((byte)(bVar6 << 5 | (byte)(bVar6 - 8) >> 3) < 4) {
    if (x != (int *)0x0) {
      *x = iVar1;
    }
    if (y != (int *)0x0) {
      *y = iVar2;
    }
    if (comp != (int *)0x0) {
      *comp = (uint)(bVar6 >> 3);
      return 1;
    }
    return 1;
  }
LAB_0011999d:
  s->img_buffer = s->img_buffer_original;
  return 0;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp;
    int sz;
    stbi__get8(s);                   // discard Offset
    sz = stbi__get8(s);              // color type
    if( sz > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    sz = stbi__get8(s);              // image type
    // only RGB or grey allowed, +/- RLE
    if ((sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11)) return 0;
    stbi__skip(s,9);
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    sz = stbi__get8(s);               // bits per pixel
    // only RGB or RGBA or grey allowed
    if ((sz != 8) && (sz != 16) && (sz != 24) && (sz != 32)) {
        stbi__rewind(s);
        return 0;
    }
    tga_comp = sz;
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp / 8;
    return 1;                   // seems to have passed everything
}